

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::detail::unit_data::operator==(unit_data *this,unit_data *other)

{
  bool bVar1;
  bool local_19;
  unit_data *other_local;
  unit_data *this_local;
  
  bVar1 = equivalent_non_counting(this,other);
  local_19 = false;
  if ((((bVar1) && (local_19 = false, ((int)*this << 0xb) >> 0x1e == ((int)*other << 0xb) >> 0x1e))
      && (local_19 = false, ((int)*this << 4) >> 0x1e == ((int)*other << 4) >> 0x1e)) &&
     (((local_19 = false, ((int)*this << 8) >> 0x1d == ((int)*other << 8) >> 0x1d &&
       (local_19 = false, ((uint)*this >> 0x1c & 1) == ((uint)*other >> 0x1c & 1))) &&
      ((local_19 = false, ((uint)*this >> 0x1d & 1) == ((uint)*other >> 0x1d & 1) &&
       (local_19 = false, ((uint)*this >> 0x1e & 1) == ((uint)*other >> 0x1e & 1))))))) {
    local_19 = (uint)*this >> 0x1f == (uint)*other >> 0x1f;
  }
  return local_19;
}

Assistant:

constexpr bool operator==(const unit_data& other) const
        {
            return equivalent_non_counting(other) && mole_ == other.mole_ &&
                count_ == other.count_ && radians_ == other.radians_ &&
                per_unit_ == other.per_unit_ && i_flag_ == other.i_flag_ &&
                e_flag_ == other.e_flag_ && equation_ == other.equation_;
        }